

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void libserver::multiple_client_handler(void)

{
  _Iter_pred<boost::_bi::bind_t<bool,_boost::_mfi::cmf0<bool,_libserver::server>,_boost::_bi::list1<boost::arg<1>_>_>_>
  __pred;
  pointer psVar1;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  __first;
  pointer psVar2;
  scoped_lock lk;
  shared_ptr<libserver::server> b;
  unique_lock<boost::recursive_mutex> local_58;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_48;
  shared_count sStack_40;
  undefined8 local_38;
  
  do {
    local_48.super_time_duration.
    super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    .ticks_.value_ =
         (time_duration)
         (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
          )0x3e8;
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(&local_48);
    psVar1 = server_shared_ptrs.
             super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = server_shared_ptrs.
                  super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      local_48.super_time_duration.
      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
      .ticks_.value_ = (time_duration)psVar2->px;
      sStack_40.pi_ = (psVar2->pn).pi_;
      if (sStack_40.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_40.pi_)->use_count_ = (sStack_40.pi_)->use_count_ + 1;
        UNLOCK();
      }
      if (local_48.super_time_duration.
          super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
          .ticks_.value_ ==
          (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           )0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<libserver::server>::operator->() const [T = libserver::server]"
                     );
      }
      server::handle_client
                ((server *)
                 local_48.super_time_duration.
                 super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                 .ticks_.value_);
      boost::detail::shared_count::~shared_count(&sStack_40);
    }
    local_58.m = &cs;
    local_58.is_locked = false;
    boost::unique_lock<boost::recursive_mutex>::lock(&local_58);
    local_48.super_time_duration.
    super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    .ticks_.value_ = (time_duration)server::_is_timed_out;
    sStack_40.pi_ = (sp_counted_base *)0x0;
    __pred._M_pred._16_8_ = local_38;
    __pred._M_pred.f_ = (cmf0<bool,_boost::shared_mutex::state_data>)ZEXT816(0x10e5fe);
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<boost::shared_ptr<libserver::server>*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>,__gnu_cxx::__ops::_Iter_pred<boost::_bi::bind_t<bool,boost::_mfi::cmf0<bool,libserver::server>,boost::_bi::list1<boost::arg<1>>>>>
                        ((__normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
                          )server_shared_ptrs.
                           super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
                          )server_shared_ptrs.
                           super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__pred);
    std::
    vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
    ::_M_erase(&server_shared_ptrs,(iterator)__first._M_current,
               (iterator)
               server_shared_ptrs.
               super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (local_58.is_locked == true) {
      boost::recursive_mutex::unlock(local_58.m);
    }
  } while( true );
}

Assistant:

void libserver::multiple_client_handler()
{
    while ( true) {
        boost::this_thread::sleep( boost::posix_time::millisec(1));
        for (auto b:server_shared_ptrs) 
            (b)->handle_client();
        // erase clients that timed out
        boost::recursive_mutex::scoped_lock lk(cs);
        server_shared_ptrs.erase(std::remove_if(server_shared_ptrs.begin(), server_shared_ptrs.end(), 
                   boost::bind(&libserver::server::_is_timed_out,boost::placeholders::_1)), server_shared_ptrs.end());
    }
}